

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O1

Pdr_Obl_t * Pdr_OblStart(int k,int prio,Pdr_Set_t *pState,Pdr_Obl_t *pNext)

{
  Pdr_Obl_t *pPVar1;
  
  pPVar1 = (Pdr_Obl_t *)malloc(0x28);
  pPVar1->iFrame = k;
  pPVar1->prio = prio;
  pPVar1->nRefs = 1;
  pPVar1->pState = pState;
  pPVar1->pNext = pNext;
  pPVar1->pLink = (Pdr_Obl_t *)0x0;
  return pPVar1;
}

Assistant:

Pdr_Obl_t * Pdr_OblStart( int k, int prio, Pdr_Set_t * pState, Pdr_Obl_t * pNext )
{
    Pdr_Obl_t * p;
    p = ABC_ALLOC( Pdr_Obl_t, 1 );
    p->iFrame = k;
    p->prio   = prio;
    p->nRefs  = 1;
    p->pState = pState;
    p->pNext  = pNext;
    p->pLink  = NULL;
    return p;    
}